

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_BonusTiles_Test::~TEST_WiningStateTest_BonusTiles_Test
          (TEST_WiningStateTest_BonusTiles_Test *this)

{
  TEST_WiningStateTest_BonusTiles_Test *mem;
  TEST_WiningStateTest_BonusTiles_Test *this_local;
  
  mem = this;
  ~TEST_WiningStateTest_BonusTiles_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(WiningStateTest, BonusTiles)
{
	addPair(Tile::OneOfBamboos);
	addSequence(Tile::TwoOfBamboos);
	addSequence(Tile::ThreeOfCharacters);
	addTriplet(Tile::SixOfCircles);
	addSequence(Tile::SevenOfCharacters);

	s.addBonusTile(Tile::OneOfBamboos);
	s.addBonusTile(Tile::SixOfCircles);
	s.addBonusTile(Tile::NineOfCharacters);

	selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::SelfDrawn));
	CHECK_EQUAL(6, r.bonus_tile_count);
	CHECK_EQUAL(7, r.doubling_factor);
}